

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void * js_realloc2(JSContext *ctx,void *ptr,size_t size,size_t *pslack)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  
  pvVar1 = (*(ctx->rt->mf).js_realloc)(&ctx->rt->malloc_state,ptr,size);
  if (size == 0 || pvVar1 != (void *)0x0) {
    if (pslack != (size_t *)0x0) {
      sVar2 = (*(ctx->rt->mf).js_malloc_usable_size)(pvVar1);
      sVar3 = 0;
      if (size <= sVar2) {
        sVar3 = sVar2 - size;
      }
      *pslack = sVar3;
    }
  }
  else {
    JS_ThrowOutOfMemory(ctx);
  }
  return pvVar1;
}

Assistant:

void *js_realloc2(JSContext *ctx, void *ptr, size_t size, size_t *pslack)
{
    void *ret;
    ret = js_realloc_rt(ctx->rt, ptr, size);
    if (unlikely(!ret && size != 0)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    if (pslack) {
        size_t new_size = js_malloc_usable_size_rt(ctx->rt, ret);
        *pslack = (new_size > size) ? new_size - size : 0;
    }
    return ret;
}